

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_sextract_i32_riscv32
               (TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg,uint ofs,uint len)

{
  int iVar1;
  TCGOp *pTVar2;
  uintptr_t o;
  
  iVar1 = len + ofs;
  if (iVar1 == 0x20) {
    ofs = 0x20 - len;
  }
  else {
    if (ofs == 0) {
      if (len == 8) goto LAB_00a57000;
      if (len == 0x10) goto LAB_00a56fce;
    }
    else if (len == 8 && ofs == 8) {
      pTVar2 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_sextract_i32);
      pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar2->args[1] = (TCGArg)(arg + (long)tcg_ctx);
      pTVar2->args[2] = 8;
      pTVar2->args[3] = 8;
      return;
    }
    if (iVar1 == 8) {
      tcg_gen_ext8s_i32_riscv32(tcg_ctx,ret,arg);
      arg = ret;
    }
    else if (iVar1 == 0x10) {
      tcg_gen_ext16s_i32_riscv32(tcg_ctx,ret,arg);
      arg = ret;
    }
    else {
      if (len == 8) {
        tcg_gen_shri_i32_riscv32(tcg_ctx,ret,arg,ofs);
        arg = ret;
LAB_00a57000:
        tcg_gen_ext8s_i32_riscv32(tcg_ctx,ret,arg);
        return;
      }
      if (len == 0x10) {
        tcg_gen_shri_i32_riscv32(tcg_ctx,ret,arg,ofs);
        arg = ret;
LAB_00a56fce:
        tcg_gen_ext16s_i32_riscv32(tcg_ctx,ret,arg);
        return;
      }
      tcg_gen_shli_i32_riscv32(tcg_ctx,ret,arg,(0x20 - len) - ofs);
      arg = ret;
      ofs = 0x20 - len;
    }
  }
  tcg_gen_sari_i32_riscv32(tcg_ctx,ret,arg,ofs);
  return;
}

Assistant:

void tcg_gen_sextract_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg,
                          unsigned int ofs, unsigned int len)
{
    tcg_debug_assert(ofs < 32);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 32);
    tcg_debug_assert(ofs + len <= 32);

    /* Canonicalize certain special cases, even if extract is supported.  */
    if (ofs + len == 32) {
        tcg_gen_sari_i32(tcg_ctx, ret, arg, 32 - len);
        return;
    }
    if (ofs == 0) {
        switch (len) {
        case 16:
            tcg_gen_ext16s_i32(tcg_ctx, ret, arg);
            return;
        case 8:
            tcg_gen_ext8s_i32(tcg_ctx, ret, arg);
            return;
        }
    }

    if (TCG_TARGET_HAS_sextract_i32
        && TCG_TARGET_extract_i32_valid(ofs, len)) {
        tcg_gen_op4ii_i32(tcg_ctx, INDEX_op_sextract_i32, ret, arg, ofs, len);
        return;
    }

    /* Assume that sign-extension, if available, is cheaper than a shift.  */
    switch (ofs + len) {
    case 16:
        if (TCG_TARGET_HAS_ext16s_i32) {
            tcg_gen_ext16s_i32(tcg_ctx, ret, arg);
            tcg_gen_sari_i32(tcg_ctx, ret, ret, ofs);
            return;
        }
        break;
    case 8:
        if (TCG_TARGET_HAS_ext8s_i32) {
            tcg_gen_ext8s_i32(tcg_ctx, ret, arg);
            tcg_gen_sari_i32(tcg_ctx, ret, ret, ofs);
            return;
        }
        break;
    }
    switch (len) {
    case 16:
        if (TCG_TARGET_HAS_ext16s_i32) {
            tcg_gen_shri_i32(tcg_ctx, ret, arg, ofs);
            tcg_gen_ext16s_i32(tcg_ctx, ret, ret);
            return;
        }
        break;
    case 8:
        if (TCG_TARGET_HAS_ext8s_i32) {
            tcg_gen_shri_i32(tcg_ctx, ret, arg, ofs);
            tcg_gen_ext8s_i32(tcg_ctx, ret, ret);
            return;
        }
        break;
    }

    tcg_gen_shli_i32(tcg_ctx, ret, arg, 32 - len - ofs);
    tcg_gen_sari_i32(tcg_ctx, ret, ret, 32 - len);
}